

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O3

bool __thiscall OpenMD::SectionParser::isEndSection(SectionParser *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  string keyword;
  string section;
  StringTokenizer tokenizer;
  string local_b0;
  string local_90;
  StringTokenizer local_70;
  
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_70,line,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_70);
  if (iVar2 < 2) {
    bVar3 = false;
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_b0,&local_70);
    iVar2 = std::__cxx11::string::compare((char *)&local_b0);
    if (iVar2 == 0) {
      StringTokenizer::nextToken_abi_cxx11_(&local_90,&local_70);
      if (local_90._M_string_length == (this->sectionName_)._M_string_length) {
        if (local_90._M_string_length == 0) {
          bVar3 = true;
        }
        else {
          iVar2 = bcmp(local_90._M_dataplus._M_p,(this->sectionName_)._M_dataplus._M_p,
                       local_90._M_string_length);
          bVar3 = iVar2 == 0;
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.delim_._M_dataplus._M_p != &local_70.delim_.field_2) {
    operator_delete(local_70.delim_._M_dataplus._M_p,
                    local_70.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.tokenString_._M_dataplus._M_p != &local_70.tokenString_.field_2) {
    operator_delete(local_70.tokenString_._M_dataplus._M_p,
                    local_70.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool SectionParser::isEndSection(const std::string& line) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string keyword = tokenizer.nextToken();

      if (keyword != "end") { return false; }

      std::string section = tokenizer.nextToken();
      if (section == sectionName_) {
        return true;
      } else {
        return false;
      }

    } else {
      return false;
    }
  }